

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

void RigidBodyDynamics::Math::SparseFactorizeLTL(Model *model,MatrixNd *H)

{
  double *pdVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  uVar8 = (ulong)model->qdot_size;
  uVar12 = 1;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    lVar11 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    puVar5 = (undefined8 *)
             (lVar11 * 8 * uVar12 + lVar3 +
             (long)(H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data);
    for (uVar7 = uVar12; uVar7 < uVar8; uVar7 = uVar7 + 1) {
      *puVar5 = 0;
      puVar5 = puVar5 + lVar11;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
    lVar3 = lVar3 + 8;
  }
  while (uVar12 = uVar8 - 1, uVar8 != 0) {
    uVar4 = uVar12 & 0xffffffff;
    dVar13 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             [(H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
              * uVar4 + uVar4];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    pdVar1 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar3 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    pdVar1[lVar3 * uVar4 + uVar4] = dVar13;
    puVar2 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6 = puVar2 + uVar8;
    puVar9 = puVar6;
    while( true ) {
      uVar10 = *puVar9;
      if ((ulong)uVar10 == 0) break;
      lVar11 = (ulong)(uVar10 - 1) * lVar3;
      pdVar1[uVar4 + lVar11] = pdVar1[uVar4 + lVar11] / pdVar1[lVar3 * uVar4 + uVar4];
      puVar9 = puVar2 + uVar10;
    }
    while( true ) {
      uVar10 = *puVar6;
      uVar7 = (ulong)uVar10;
      uVar8 = uVar12;
      if (uVar7 == 0) break;
      uVar8 = (ulong)(uVar10 - 1);
      for (; uVar10 != 0; uVar10 = puVar2[uVar10]) {
        lVar11 = (ulong)(uVar10 - 1) * lVar3;
        pdVar1[lVar11 + uVar8] =
             pdVar1[lVar11 + uVar8] - pdVar1[uVar4 + lVar3 * uVar8] * pdVar1[lVar11 + uVar4];
      }
      puVar6 = puVar2 + uVar7;
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseFactorizeLTL (Model &model, Math::MatrixNd &H) {
  for (unsigned int i = 0; i < model.qdot_size; i++) {
    for (unsigned int j = i + 1; j < model.qdot_size; j++) {
      H(i,j) = 0.;
    }
  }

  for (unsigned int k = model.qdot_size; k > 0; k--) {
    H(k - 1,k - 1) = sqrt (H(k - 1,k - 1));
    unsigned int i = model.lambda_q[k];
    while (i != 0) {
      H(k - 1,i - 1) = H(k - 1,i - 1) / H(k - 1,k - 1);
      i = model.lambda_q[i];
    }

    i = model.lambda_q[k];
    while (i != 0) {
      unsigned int j = i;
      while (j != 0) {
        H(i - 1,j - 1) = H(i - 1,j - 1) - H(k - 1,i - 1) * H(k - 1, j - 1);
        j = model.lambda_q[j];
      }
      i = model.lambda_q[i];
    }
  }
}